

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsMan.c
# Opt level: O2

void Mfs_ManPrint(Mfs_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Mfs_Par_t *pMVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  
  if (p->pPars->fResub == 0) {
    printf("Nodes = %d. Try = %d. Total mints = %d. Local DC mints = %d. Ratio = %5.2f.\n",
           (double)(p->nMintsTotal - p->nMintsCare) / (double)p->nMintsTotal,
           (ulong)(uint)p->nTotalNodesBeg,(ulong)(uint)p->nNodesTried);
    iVar7 = 0x74a6e0;
    printf("Nodes resyn = %d. Ratio = %5.2f.  Total AIG node gain = %d. Timeouts = %d.\n",
           (double)p->nNodesDec / (double)p->nNodesTried,(ulong)(uint)p->nNodesDec,
           (ulong)(uint)p->nNodesGained,(ulong)(uint)p->nTimeOuts);
  }
  else {
    printf("Nodes = %d. Try = %d. Resub = %d. Div = %d. SAT calls = %d. Timeouts = %d. MaxDivs = %d.\n"
           ,(ulong)(uint)p->nTotalNodesBeg,(ulong)(uint)p->nNodesTried,(ulong)(uint)p->nNodesResub,
           (ulong)(uint)p->nTotalDivs,(ulong)(uint)p->nSatCalls);
    printf("Attempts :   ");
    iVar2 = 1;
    iVar7 = iVar2;
    if (1 < p->nTryRemoves) {
      iVar7 = p->nTryRemoves;
    }
    printf("Remove %6d out of %6d (%6.2f %%)   ",((double)p->nRemoves * 100.0) / (double)iVar7);
    iVar7 = iVar2;
    if (1 < p->nTryResubs) {
      iVar7 = p->nTryResubs;
    }
    printf("Resub  %6d out of %6d (%6.2f %%)   ",((double)p->nResubs * 100.0) / (double)iVar7);
    iVar7 = 10;
    putchar(10);
    printf("Reduction:   ");
    iVar5 = p->nTotalNodesBeg;
    iVar3 = iVar2;
    if (1 < iVar5) {
      iVar3 = iVar5;
    }
    printf("Nodes  %6d out of %6d (%6.2f %%)   ",
           ((double)(iVar5 - p->nTotalNodesEnd) * 100.0) / (double)iVar3);
    iVar5 = p->nTotalEdgesBeg;
    if (1 < iVar5) {
      iVar2 = iVar5;
    }
    printf("Edges  %6d out of %6d (%6.2f %%)   ",
           ((double)(iVar5 - p->nTotalEdgesEnd) * 100.0) / (double)iVar2);
    putchar(10);
    pMVar6 = p->pPars;
    if (pMVar6->fPower != 0) {
      dVar8 = (double)(p->TotalSwitchingBeg - p->TotalSwitchingEnd);
      iVar7 = 0x74a642;
      printf("Power( %5.2f, %4.2f%%) \n",dVar8,(dVar8 * 100.0) / (double)p->TotalSwitchingBeg);
      pMVar6 = p->pPars;
    }
    if (pMVar6->fSwapEdge != 0) {
      uVar1 = p->nNodesResub;
      uVar4 = Abc_NtkGetTotalFanins(p->pNtk);
      iVar2 = p->nNodesResub;
      iVar5 = Abc_NtkGetTotalFanins(p->pNtk);
      iVar7 = 0x74a65b;
      printf("Swappable edges = %d. Total edges = %d. Ratio = %5.2f.\n",
             (double)iVar2 / (double)iVar5,(ulong)uVar1,(ulong)uVar4);
    }
  }
  Abc_Print(iVar7,"%s =","Win");
  dVar8 = 0.0;
  if (p->timeTotal != 0) {
    dVar8 = ((double)p->timeWin * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",(double)p->timeWin / 1000000.0,dVar8);
  Abc_Print(iVar7,"%s =","Div");
  dVar8 = 0.0;
  if (p->timeTotal != 0) {
    dVar8 = ((double)p->timeDiv * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",(double)p->timeDiv / 1000000.0,dVar8);
  Abc_Print(iVar7,"%s =","Aig");
  dVar8 = 0.0;
  if (p->timeTotal != 0) {
    dVar8 = ((double)p->timeAig * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",(double)p->timeAig / 1000000.0,dVar8);
  Abc_Print(iVar7,"%s =","Gia");
  dVar8 = 0.0;
  if (p->timeTotal != 0) {
    dVar8 = ((double)p->timeGia * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",(double)p->timeGia / 1000000.0,dVar8);
  Abc_Print(iVar7,"%s =","Cnf");
  dVar8 = 0.0;
  if (p->timeTotal != 0) {
    dVar8 = ((double)p->timeCnf * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",(double)p->timeCnf / 1000000.0,dVar8);
  Abc_Print(iVar7,"%s =","Sat");
  dVar9 = (double)(p->timeSat - p->timeInt);
  dVar8 = 0.0;
  if (p->timeTotal != 0) {
    dVar8 = (dVar9 * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",dVar9 / 1000000.0,dVar8);
  Abc_Print(iVar7,"%s =","Int");
  dVar8 = 0.0;
  if (p->timeTotal != 0) {
    dVar8 = ((double)p->timeInt * 100.0) / (double)p->timeTotal;
  }
  Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",(double)p->timeInt / 1000000.0,dVar8);
  Abc_Print(iVar7,"%s =","ALL");
  dVar8 = (double)p->timeTotal;
  dVar9 = 0.0;
  if (p->timeTotal != 0) {
    dVar9 = (dVar8 * 100.0) / dVar8;
  }
  Abc_Print(iVar7,"%9.2f sec (%6.2f %%)\n",dVar8 / 1000000.0,dVar9);
  return;
}

Assistant:

void Mfs_ManPrint( Mfs_Man_t * p )
{
    if ( p->pPars->fResub )
    {
        printf( "Nodes = %d. Try = %d. Resub = %d. Div = %d. SAT calls = %d. Timeouts = %d. MaxDivs = %d.\n",
            p->nTotalNodesBeg, p->nNodesTried, p->nNodesResub, p->nTotalDivs, p->nSatCalls, p->nTimeOuts, p->nMaxDivs );

        printf( "Attempts :   " );
        printf( "Remove %6d out of %6d (%6.2f %%)   ", p->nRemoves, p->nTryRemoves, 100.0*p->nRemoves/Abc_MaxInt(1, p->nTryRemoves) );
        printf( "Resub  %6d out of %6d (%6.2f %%)   ", p->nResubs,  p->nTryResubs,  100.0*p->nResubs /Abc_MaxInt(1, p->nTryResubs)  );
        printf( "\n" );

        printf( "Reduction:   " );
        printf( "Nodes  %6d out of %6d (%6.2f %%)   ", p->nTotalNodesBeg-p->nTotalNodesEnd, p->nTotalNodesBeg, 100.0*(p->nTotalNodesBeg-p->nTotalNodesEnd)/Abc_MaxInt(1, p->nTotalNodesBeg) );
        printf( "Edges  %6d out of %6d (%6.2f %%)   ", p->nTotalEdgesBeg-p->nTotalEdgesEnd, p->nTotalEdgesBeg, 100.0*(p->nTotalEdgesBeg-p->nTotalEdgesEnd)/Abc_MaxInt(1, p->nTotalEdgesBeg) );
        printf( "\n" );

        if (p->pPars->fPower)
            printf( "Power( %5.2f, %4.2f%%) \n",
                 p->TotalSwitchingBeg - p->TotalSwitchingEnd,
                 100.0*(p->TotalSwitchingBeg-p->TotalSwitchingEnd)/p->TotalSwitchingBeg );
        if ( p->pPars->fSwapEdge )
            printf( "Swappable edges = %d. Total edges = %d. Ratio = %5.2f.\n",
                p->nNodesResub, Abc_NtkGetTotalFanins(p->pNtk), 1.00 * p->nNodesResub / Abc_NtkGetTotalFanins(p->pNtk) );
//        printf( "Average ratio of DCs in the resubed nodes = %.2f.\n", 1.0*p->nDcMints/(64 * p->nNodesResub) );
    }
    else
    {
        printf( "Nodes = %d. Try = %d. Total mints = %d. Local DC mints = %d. Ratio = %5.2f.\n", 
            p->nTotalNodesBeg, p->nNodesTried, p->nMintsTotal, p->nMintsTotal-p->nMintsCare, 
            1.0 * (p->nMintsTotal-p->nMintsCare) / p->nMintsTotal );
//        printf( "Average ratio of sequential DCs in the global space = %5.2f.\n", 
//            1.0-(p->dTotalRatios/p->nNodesTried) );
        printf( "Nodes resyn = %d. Ratio = %5.2f.  Total AIG node gain = %d. Timeouts = %d.\n", 
            p->nNodesDec, 1.0 * p->nNodesDec / p->nNodesTried, p->nNodesGained, p->nTimeOuts );
    }

    ABC_PRTP( "Win", p->timeWin            ,  p->timeTotal );
    ABC_PRTP( "Div", p->timeDiv            ,  p->timeTotal );
    ABC_PRTP( "Aig", p->timeAig            ,  p->timeTotal );
    ABC_PRTP( "Gia", p->timeGia            ,  p->timeTotal );
    ABC_PRTP( "Cnf", p->timeCnf            ,  p->timeTotal );
    ABC_PRTP( "Sat", p->timeSat-p->timeInt ,  p->timeTotal );
    ABC_PRTP( "Int", p->timeInt            ,  p->timeTotal );
    ABC_PRTP( "ALL", p->timeTotal          ,  p->timeTotal );

}